

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.h
# Opt level: O2

void __thiscall xLearn::FMScore::~FMScore(FMScore *this)

{
  Score::~Score(&this->super_Score);
  operator_delete(this);
  return;
}

Assistant:

~FMScore() { }